

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_hor_uv(pel *src,pel *dst,int i_dst,int w,int h)

{
  undefined2 uVar1;
  int iVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)w;
  if (w < 1) {
    uVar3 = 0;
  }
  iVar2 = 0;
  if (h < 1) {
    h = 0;
    iVar2 = 0;
  }
  for (; iVar2 != h; iVar2 = iVar2 + 1) {
    uVar1 = *(undefined2 *)src;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined2 *)(dst + uVar4 * 2) = uVar1;
    }
    dst = dst + i_dst;
    src = src + -2;
  }
  return;
}

Assistant:

void ipred_hor_uv(pel *src, pel *dst, int i_dst, int w, int h)
{
    int i;
    int shift = sizeof(pel) * 8;
    
    for (i = 0; i < h; i++) {
        int uv_pixel = (src[1] << shift) + src[0];
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
        src -= 2;
    }
}